

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void FindHoveredWindow(void)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImVec2 hole_size;
  ImVec2 hole_pos;
  ImRect bb;
  ImGuiWindow *window;
  int i;
  ImVec2 padding_for_resize;
  ImVec2 padding_regular;
  ImGuiWindow *hovered_window_ignoring_moving_window;
  ImGuiWindow *hovered_window;
  ImGuiContext *g;
  ImVec2 *this;
  ImVec2 *local_78;
  ImVec2 local_70;
  ImRect local_68;
  ImVec2 local_58;
  ImVec2 local_50;
  ImRect local_48;
  ImGuiWindow *local_38;
  int local_2c;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiWindow *local_18;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = (ImGuiWindow *)0x0;
  local_18 = (ImGuiWindow *)0x0;
  if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) && ((GImGui->MovingWindow->Flags & 0x200U) == 0))
  {
    local_10 = GImGui->MovingWindow;
  }
  local_20 = (GImGui->Style).TouchExtraPadding;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) == 0) {
    local_78 = &local_20;
  }
  else {
    local_78 = &GImGui->WindowsHoverPadding;
  }
  local_28 = *local_78;
  local_2c = (GImGui->Windows).Size;
LAB_0011ba5f:
  do {
    do {
      local_2c = local_2c + -1;
      if (local_2c < 0) goto LAB_0011bc7e;
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_2c);
      local_38 = *ppIVar2;
    } while ((((local_38->Active & 1U) == 0) || ((local_38->Hidden & 1U) != 0)) ||
            ((local_38->Flags & 0x200U) != 0));
    local_48.Min = (local_38->OuterRectClipped).Min;
    local_48.Max = (local_38->OuterRectClipped).Max;
    if ((local_38->Flags & 0x1000042U) == 0) {
      ImRect::Expand(&local_48,&local_28);
    }
    else {
      ImRect::Expand(&local_48,&local_20);
    }
    bVar1 = ImRect::Contains(&local_48,&(local_8->IO).MousePos);
  } while (!bVar1);
  if ((local_38->HitTestHoleSize).x != 0) {
    this = &local_50;
    ImVec2::ImVec2(this,(local_38->Pos).x + (float)(int)(local_38->HitTestHoleOffset).x,
                   (local_38->Pos).y + (float)(int)(local_38->HitTestHoleOffset).y);
    ImVec2::ImVec2(&local_58,(float)(int)(local_38->HitTestHoleSize).x,
                   (float)(int)(local_38->HitTestHoleSize).y);
    local_70 = operator+(this,(ImVec2 *)0x11bbbf);
    ImRect::ImRect(&local_68,&local_50,&local_70);
    bVar1 = ImRect::Contains(&local_68,&(local_8->IO).MousePos);
    if (bVar1) goto LAB_0011ba5f;
  }
  if (local_10 == (ImGuiWindow *)0x0) {
    local_10 = local_38;
  }
  if ((local_18 == (ImGuiWindow *)0x0) &&
     ((local_8->MovingWindow == (ImGuiWindow *)0x0 ||
      (local_38->RootWindow != local_8->MovingWindow->RootWindow)))) {
    local_18 = local_38;
  }
  if ((local_10 != (ImGuiWindow *)0x0) && (local_18 != (ImGuiWindow *)0x0)) {
LAB_0011bc7e:
    local_8->HoveredWindow = local_10;
    local_8->HoveredWindowUnderMovingWindow = local_18;
    return;
  }
  goto LAB_0011ba5f;
}

Assistant:

static void FindHoveredWindow()
{
    ImGuiContext& g = *GImGui;

    ImGuiWindow* hovered_window = NULL;
    ImGuiWindow* hovered_window_ignoring_moving_window = NULL;
    if (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoMouseInputs))
        hovered_window = g.MovingWindow;

    ImVec2 padding_regular = g.Style.TouchExtraPadding;
    ImVec2 padding_for_resize = g.IO.ConfigWindowsResizeFromEdges ? g.WindowsHoverPadding : padding_regular;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        IM_MSVC_WARNING_SUPPRESS(28182); // [Static Analyzer] Dereferencing NULL pointer.
        if (!window->Active || window->Hidden)
            continue;
        if (window->Flags & ImGuiWindowFlags_NoMouseInputs)
            continue;

        // Using the clipped AABB, a child window will typically be clipped by its parent (not always)
        ImRect bb(window->OuterRectClipped);
        if (window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_AlwaysAutoResize))
            bb.Expand(padding_regular);
        else
            bb.Expand(padding_for_resize);
        if (!bb.Contains(g.IO.MousePos))
            continue;

        // Support for one rectangular hole in any given window
        // FIXME: Consider generalizing hit-testing override (with more generic data, callback, etc.) (#1512)
        if (window->HitTestHoleSize.x != 0)
        {
            ImVec2 hole_pos(window->Pos.x + (float)window->HitTestHoleOffset.x, window->Pos.y + (float)window->HitTestHoleOffset.y);
            ImVec2 hole_size((float)window->HitTestHoleSize.x, (float)window->HitTestHoleSize.y);
            if (ImRect(hole_pos, hole_pos + hole_size).Contains(g.IO.MousePos))
                continue;
        }

        if (hovered_window == NULL)
            hovered_window = window;
        IM_MSVC_WARNING_SUPPRESS(28182); // [Static Analyzer] Dereferencing NULL pointer.
        if (hovered_window_ignoring_moving_window == NULL && (!g.MovingWindow || window->RootWindow != g.MovingWindow->RootWindow))
            hovered_window_ignoring_moving_window = window;
        if (hovered_window && hovered_window_ignoring_moving_window)
            break;
    }

    g.HoveredWindow = hovered_window;
    g.HoveredWindowUnderMovingWindow = hovered_window_ignoring_moving_window;
}